

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pointer.h
# Opt level: O0

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::Get(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            *root,size_t *unresolvedTokenIndex)

{
  uint uVar1;
  bool bVar2;
  Type TVar3;
  SizeType SVar4;
  Pointer pGVar5;
  long *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  long in_RDI;
  MemberIterator m;
  Token *t;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *v;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  NonConstIterator local_58;
  ConstIterator local_50;
  GenericStringRef<char> local_48;
  GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_38;
  undefined8 *local_30;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_28;
  
  local_30 = *(undefined8 **)(in_RDI + 0x18);
  local_28 = in_RSI;
  do {
    if (local_30 == (undefined8 *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20) * 0x10)) {
      return local_28;
    }
    TVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetType(local_28);
    if (TVar3 == kObjectType) {
      this_00 = local_28;
      GenericStringRef<char>::GenericStringRef
                (&local_48,(char *)*local_30,*(SizeType *)(local_30 + 1));
      GenericStringRef::operator_cast_to_char_((GenericStringRef *)&local_48);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::FindMember(in_RSI,(Ch *)in_RDX);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::MemberEnd(this_00);
      GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericMemberIterator(&local_50,&local_58);
      bVar2 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::operator==(&local_38,local_50);
      if (bVar2) {
LAB_0011567d:
        if (in_RDX != (long *)0x0) {
          *in_RDX = (long)local_30 - *(long *)(in_RDI + 0x18) >> 4;
        }
        return (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)0x0;
      }
      pGVar5 = GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               ::operator->(&local_38);
      local_28 = &pGVar5->value;
    }
    else {
      if (((TVar3 != kArrayType) || (*(int *)((long)local_30 + 0xc) == -1)) ||
         (uVar1 = *(uint *)((long)local_30 + 0xc),
         SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::Size(local_28), SVar4 <= uVar1)) goto LAB_0011567d;
      local_28 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](local_28,*(SizeType *)((long)local_30 + 0xc));
    }
    local_30 = local_30 + 2;
  } while( true );
}

Assistant:

ValueType* Get(ValueType& root, size_t* unresolvedTokenIndex = 0) const {
        RAPIDJSON_ASSERT(IsValid());
        ValueType* v = &root;
        for (const Token *t = tokens_; t != tokens_ + tokenCount_; ++t) {
            switch (v->GetType()) {
            case kObjectType:
                {
                    typename ValueType::MemberIterator m = v->FindMember(GenericStringRef<Ch>(t->name, t->length));
                    if (m == v->MemberEnd())
                        break;
                    v = &m->value;
                }
                continue;
            case kArrayType:
                if (t->index == kPointerInvalidIndex || t->index >= v->Size())
                    break;
                v = &((*v)[t->index]);
                continue;
            default:
                break;
            }

            // Error: unresolved token
            if (unresolvedTokenIndex)
                *unresolvedTokenIndex = static_cast<size_t>(t - tokens_);
            return 0;
        }
        return v;
    }